

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void Configlist_init(void)

{
  current = (config *)0x0;
  basis = (config *)0x0;
  currentend = &current;
  basisend = &basis;
  Configtable_init();
  return;
}

Assistant:

void Configlist_init(void){
  current = 0;
  currentend = &current;
  basis = 0;
  basisend = &basis;
  Configtable_init();
  return;
}